

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> kj::anon_unknown_0::TestWebSocketService::doWebSocket(WebSocket *ws,StringPtr message)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  TransformPromiseNodeBase *pTVar3;
  long lVar4;
  char *pcVar5;
  PromiseNode *extraout_RDX;
  _func_int **pp_Var6;
  Promise<void> PVar7;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_98;
  undefined1 local_88 [32];
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  String copy;
  StringPtr message_local;
  
  message_local.content.ptr = (char *)message.content.size_;
  pp_Var6 = (_func_int **)message.content.ptr;
  str<kj::StringPtr&>(&copy,(kj *)&message_local,(StringPtr *)message_local.content.ptr);
  pcVar5 = (char *)copy.content.size_;
  if (copy.content.size_ != 0) {
    pcVar5 = copy.content.ptr;
  }
  lVar4 = 0;
  if (copy.content.size_ != 0) {
    lVar4 = copy.content.size_ - 1;
  }
  (**(code **)(*pp_Var6 + 8))(local_88,pp_Var6,pcVar5,lVar4);
  Promise<void>::attach<kj::String>((Promise<void> *)(local_88 + 0x10),(String *)local_88);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,(Own<kj::_::PromiseNode> *)(local_88 + 0x10),
             _::
             TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:1964:15),_kj::_::PropagateException>
             ::anon_class_8_1_3fcf679a_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00425470;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode = pp_Var6;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,kj::_::Void,kj::(anonymous_namespace)::TestWebSocketService::doWebSocket(kj::WebSocket&,kj::StringPtr)::{lambda()#1},kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)pTVar3;
  _::maybeChain<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
            (&local_68,
             (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             &intermediate);
  pPVar2 = local_68.ptr;
  pDVar1 = local_68.disposer;
  local_58.disposer = local_68.disposer;
  local_68.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_68);
  local_98.disposer = pDVar1;
  local_98.ptr = pPVar2;
  local_58.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_98,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:1966:13),_kj::_::PropagateException>
             ::anon_class_8_1_3fcf679a_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004254f8;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode = pp_Var6;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::(anonymous_namespace)::TestWebSocketService::doWebSocket(kj::WebSocket&,kj::StringPtr)::{lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)#1},kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)pTVar3;
  _::maybeChain<void>(&local_68,(Promise<void> *)&intermediate);
  pPVar2 = local_68.ptr;
  local_58.disposer = local_68.disposer;
  local_68.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_68);
  ws->_vptr_WebSocket = (_func_int **)local_68.disposer;
  ws[1]._vptr_WebSocket = (_func_int **)pPVar2;
  local_58.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&local_98);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_88 + 0x10));
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_88);
  Array<char>::~Array(&copy.content);
  PVar7.super_PromiseBase.node.ptr = extraout_RDX;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)ws;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

static kj::Promise<void> doWebSocket(WebSocket& ws, kj::StringPtr message) {
    auto copy = kj::str(message);
    return ws.send(copy).attach(kj::mv(copy))
        .then([&ws]() {
      return ws.receive();
    }).then([&ws](WebSocket::Message&& message) {
      KJ_SWITCH_ONEOF(message) {
        KJ_CASE_ONEOF(str, kj::String) {
          return doWebSocket(ws, kj::str("reply:", str));
        }
        KJ_CASE_ONEOF(data, kj::Array<byte>) {
          return doWebSocket(ws, kj::str("reply:", data));
        }
        KJ_CASE_ONEOF(close, WebSocket::Close) {
          auto reason = kj::str("close-reply:", close.reason);
          return ws.close(close.code + 1, reason).attach(kj::mv(reason));
        }
      }
      KJ_UNREACHABLE;
    });
  }